

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::LineInterpolationTestInstance::iterate
          (TestStatus *__return_storage_ptr__,LineInterpolationTestInstance *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float *pfVar3;
  ostringstream *poVar4;
  undefined8 uVar5;
  deUint32 width;
  TestLog *log;
  bool bVar6;
  int iVar7;
  float *pfVar8;
  int vtxNdx;
  ulong uVar9;
  int vtxNdx_1;
  long lVar10;
  long lVar11;
  float extraout_XMM0_Da;
  float fVar12;
  float extraout_XMM0_Da_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  _Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
  local_268;
  RasterizationArguments local_24c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  ScopedLogSection section;
  IVec4 colorBits;
  string iterationDescription;
  SceneLine line;
  
  local_268._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                         this->m_iteration + 1);
  de::toString<int>((string *)&drawBuffer,(int *)&local_268);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 "Test iteration ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 " / ");
  de::toString<int>((string *)&colorBuffer,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorBuffer);
  std::__cxx11::string::~string((string *)&colorBuffer);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  log = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,this->m_iteration + 1);
  de::toString<int>((string *)&resultImage,(int *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 "Iteration",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&line,&iterationDescription);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&resultImage);
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&resultImage,width,width);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (extraout_XMM0_Da <= this->m_maxLineWidth) {
    line.positions[0].m_data[0] = 1.0;
    line.positions[0].m_data[1] = 0.0;
    line.positions[0].m_data[2] = 0.0;
    line.positions[0].m_data[3] = 1.0;
    line.positions[1].m_data[0] = 0.0;
    line.positions[1].m_data[1] = 1.0;
    line.positions[1].m_data[2] = 0.0;
    line.positions[1].m_data[3] = 1.0;
    line.colors[0].m_data[0] = 0.0;
    line.colors[0].m_data[1] = 0.0;
    line.colors[0].m_data._8_8_ = &DAT_3f8000003f800000;
    deRandom_init((deRandom *)&local_24c,this->m_iteration * 1000 + this->m_primitiveTopology + 0x7b
                 );
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&drawBuffer,6);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&colorBuffer,6);
    lVar10 = 0;
    uVar9 = 0;
    while( true ) {
      if ((long)(int)((ulong)((long)drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar9)
      break;
      fVar12 = deRandom_getFloat((deRandom *)&local_24c);
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10) =
           fVar12 * 1.8 + -0.9;
      fVar12 = deRandom_getFloat((deRandom *)&local_24c);
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 4) =
           fVar12 * 1.8 + -0.9;
      *(undefined4 *)
       ((long)(drawBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 8) = 0;
      fVar12 = 1.0;
      if (this->m_projective == true) {
        fVar12 = deRandom_getFloat((deRandom *)&local_24c);
        fVar12 = fVar12 * 3.8 + 0.2;
        uVar5 = *(undefined8 *)
                 ((long)(drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
        *(ulong *)((long)(drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10) =
             CONCAT44(fVar12 * (float)((ulong)uVar5 >> 0x20),fVar12 * (float)uVar5);
        *(float *)((long)(drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 8) =
             *(float *)((long)(drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 8) *
             fVar12;
      }
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 0xc) = fVar12;
      puVar1 = (undefined8 *)((long)&line + lVar10 + (uVar9 / 3) * -0x30);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)(colorBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x10;
    }
    if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
      for (iVar7 = 1;
          iVar7 + -1 <
          (int)((ulong)((long)drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
          iVar7 = iVar7 + 2) {
        tcu::LineSceneSpec::SceneLine::SceneLine(&line);
        lVar11 = (long)(iVar7 + -1);
        line.positions[0].m_data._0_8_ =
             *(undefined8 *)
              drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11].m_data;
        line.positions[0].m_data._8_8_ =
             *(undefined8 *)
              (drawBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11].m_data + 2);
        line.positions[1].m_data._0_8_ =
             *(undefined8 *)
              drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar7].m_data;
        line.positions[1].m_data._8_8_ =
             *(undefined8 *)
              (drawBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar7].m_data + 2);
        line.colors[0].m_data._0_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11].m_data;
        line.colors[0].m_data._8_8_ =
             *(undefined8 *)
              (colorBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11].m_data + 2);
        lVar10 = (long)iVar7;
        if (this->m_flatshade != false) {
          lVar10 = lVar11;
        }
        line.colors[1].m_data._0_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar10].m_data;
        line.colors[1].m_data._8_8_ =
             *(undefined8 *)
              (colorBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10].m_data + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   *)&local_268,&line);
      }
    }
    else if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
      lVar11 = 0;
      for (lVar10 = 0;
          lVar10 < ((long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                   0x20; lVar10 = lVar10 + 1) {
        tcu::LineSceneSpec::SceneLine::SceneLine(&line);
        pfVar3 = (float *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
        line.positions[0].m_data._0_8_ = *(undefined8 *)pfVar3;
        line.positions[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
        pfVar3 = (float *)((long)drawBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar11);
        line.positions[1].m_data._0_8_ = *(undefined8 *)pfVar3;
        line.positions[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
        pfVar3 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
        line.colors[0].m_data._0_8_ = *(undefined8 *)pfVar3;
        line.colors[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
        pfVar8 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
        if (this->m_flatshade == false) {
          pfVar8 = pfVar3 + 4;
        }
        line.colors[1].m_data._0_8_ = *(undefined8 *)pfVar8;
        line.colors[1].m_data._8_8_ = *(undefined8 *)(pfVar8 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   *)&local_268,&line);
        lVar11 = lVar11 + 0x10;
      }
    }
    line.positions[0].m_data._0_8_ =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar4 = (ostringstream *)(line.positions[0].m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::operator<<((ostream *)poVar4,"Generated vertices:");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&line,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    poVar4 = (ostringstream *)(line.positions[0].m_data + 2);
    lVar10 = 0;
    for (lVar11 = 0;
        lVar11 < (int)((ulong)((long)drawBuffer.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        lVar11 = lVar11 + 1) {
      line.positions[0].m_data._0_8_ =
           ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::operator<<((ostream *)poVar4,"\t");
      tcu::operator<<((ostream *)poVar4,
                      (Vector<float,_4> *)
                      ((long)(drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10));
      std::operator<<((ostream *)poVar4,",\tcolor= ");
      tcu::operator<<((ostream *)poVar4,
                      (Vector<float,_4> *)
                      ((long)(colorBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&line,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      lVar10 = lVar10 + 0x10;
    }
    BaseRenderingTestInstance::drawPrimitives
              (&this->super_BaseRenderingTestInstance,&resultImage,&drawBuffer,&colorBuffer,
               this->m_primitiveTopology);
    line.positions[0].m_data[0] = 0.0;
    line.positions[0].m_data[1] = 0.0;
    line.positions[0].m_data[2] = 0.0;
    line.positions[0].m_data[3] = 0.0;
    line.positions[1].m_data[0] = 0.0;
    line.positions[1].m_data[1] = 0.0;
    tcu::getTextureFormatBitDepth
              ((tcu *)&colorBits,&(this->super_BaseRenderingTestInstance).m_textureFormat);
    local_24c.numSamples = (int)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
    local_24c.subpixelBits = (this->super_BaseRenderingTestInstance).m_subpixelBits;
    local_24c.redBits = colorBits.m_data[0];
    local_24c.greenBits = colorBits.m_data[1];
    local_24c.blueBits = colorBits.m_data[2];
    line.positions[0].m_data._0_8_ = local_268._M_impl.super__Vector_impl_data._M_start;
    line.positions[0].m_data._8_8_ = local_268._M_impl.super__Vector_impl_data._M_finish;
    line.positions[1].m_data._0_8_ = local_268._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
    line.positions[1].m_data[2] = extraout_XMM0_Da_00;
    bVar6 = tcu::verifyTriangulatedLineGroupInterpolation
                      (&resultImage,(LineSceneSpec *)&line,&local_24c,
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    if (!bVar6) {
      this->m_allIterationsPassed = false;
    }
    std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ::~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     *)&line);
  }
  else {
    line.positions[0].m_data._0_8_ =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar4 = (ostringstream *)(line.positions[0].m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::operator<<((ostream *)poVar4,"Line width ");
    std::ostream::operator<<(poVar4,extraout_XMM0_Da);
    std::operator<<((ostream *)poVar4," not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&line,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
  }
  iVar7 = this->m_iteration + 1;
  this->m_iteration = iVar7;
  if (iVar7 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&line,"Pass",(allocator<char> *)&local_24c);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&line);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&line,"Incorrect rasterization",(allocator<char> *)&local_24c);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&line);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base(&local_268);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus LineInterpolationTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// generate scene
		generateVertices(m_iteration, drawBuffer, colorBuffer);
		extractLines(lines, drawBuffer, colorBuffer);

		// log
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
			for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
		}

		// draw image
		drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitiveTopology);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;

			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.lines.swap(lines);
			scene.lineWidth = getLineWidth();

			if (!verifyTriangulatedLineGroupInterpolation(resultImage, scene, args, m_context.getTestContext().getLog()))
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}